

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O0

bool google::protobuf::util::ParseDelimitedFromCodedStream
               (MessageLite *message,CodedInputStream *input,bool *clean_eof)

{
  bool bVar1;
  int iVar2;
  Limit limit_00;
  int iVar3;
  Limit limit;
  int position_after_size;
  uint32_t size;
  int start;
  bool *clean_eof_local;
  CodedInputStream *input_local;
  MessageLite *message_local;
  
  if (clean_eof != (bool *)0x0) {
    *clean_eof = false;
  }
  _size = clean_eof;
  clean_eof_local = (bool *)input;
  input_local = (CodedInputStream *)message;
  position_after_size = protobuf::io::CodedInputStream::CurrentPosition(input);
  bVar1 = protobuf::io::CodedInputStream::ReadVarint32
                    ((CodedInputStream *)clean_eof_local,(uint32_t *)&limit);
  if (bVar1) {
    iVar2 = protobuf::io::CodedInputStream::CurrentPosition((CodedInputStream *)clean_eof_local);
    limit_00 = protobuf::io::CodedInputStream::PushLimit((CodedInputStream *)clean_eof_local,limit);
    bVar1 = protobuf::MessageLite::MergeFromCodedStream
                      ((MessageLite *)input_local,(CodedInputStream *)clean_eof_local);
    if (bVar1) {
      bVar1 = protobuf::io::CodedInputStream::ConsumedEntireMessage
                        ((CodedInputStream *)clean_eof_local);
      if (bVar1) {
        iVar3 = protobuf::io::CodedInputStream::CurrentPosition((CodedInputStream *)clean_eof_local)
        ;
        if (iVar3 - iVar2 == limit) {
          protobuf::io::CodedInputStream::PopLimit((CodedInputStream *)clean_eof_local,limit_00);
          message_local._7_1_ = true;
        }
        else {
          message_local._7_1_ = false;
        }
      }
      else {
        message_local._7_1_ = false;
      }
    }
    else {
      message_local._7_1_ = false;
    }
  }
  else {
    if (_size != (bool *)0x0) {
      iVar2 = protobuf::io::CodedInputStream::CurrentPosition((CodedInputStream *)clean_eof_local);
      *_size = iVar2 == position_after_size;
    }
    message_local._7_1_ = false;
  }
  return message_local._7_1_;
}

Assistant:

bool ParseDelimitedFromCodedStream(MessageLite* message,
                                   io::CodedInputStream* input,
                                   bool* clean_eof) {
  if (clean_eof != nullptr) *clean_eof = false;
  int start = input->CurrentPosition();

  // Read the size.
  uint32_t size;
  if (!input->ReadVarint32(&size)) {
    if (clean_eof != nullptr) *clean_eof = input->CurrentPosition() == start;
    return false;
  }

  // Get the position after any size bytes have been read (and only the message
  // itself remains).
  int position_after_size = input->CurrentPosition();

  // Tell the stream not to read beyond that size.
  io::CodedInputStream::Limit limit = input->PushLimit(static_cast<int>(size));

  // Parse the message.
  if (!message->MergeFromCodedStream(input)) return false;
  if (!input->ConsumedEntireMessage()) return false;
  if (input->CurrentPosition() - position_after_size != static_cast<int>(size))
    return false;

  // Release the limit.
  input->PopLimit(limit);

  return true;
}